

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
CreateAttributesDecoder
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          int32_t att_decoder_id)

{
  TraversalObserver traversal_observer;
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  size_type sVar4;
  reference pvVar5;
  Mesh *mesh_00;
  pointer sequencer_00;
  int in_ESI;
  long in_RDI;
  unique_ptr<draco::SequentialAttributeDecodersController,_std::default_delete<draco::SequentialAttributeDecodersController>_>
  att_controller;
  AttTraverser att_traverser;
  AttObserver att_observer;
  unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
  traversal_sequencer;
  MeshAttributeCornerTable *corner_table;
  MeshAttributeIndicesEncodingData *encoding_data_1;
  MeshAttributeIndicesEncodingData *encoding_data;
  unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> sequencer;
  Mesh *mesh;
  uint8_t traversal_method_encoded;
  MeshTraversalMethod traversal_method;
  uint8_t decoder_type;
  int8_t att_data_id;
  MeshAttributeCornerTable *in_stack_fffffffffffffde8;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
  *in_stack_fffffffffffffdf0;
  Mesh *in_stack_fffffffffffffdf8;
  SequentialAttributeDecodersController *in_stack_fffffffffffffe00;
  CornerTable *in_stack_fffffffffffffe08;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
  *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined8 in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  PointsSequencer *in_stack_fffffffffffffe38;
  MeshAttributeIndicesEncodingData *in_stack_ffffffffffffff40;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>
  *in_stack_ffffffffffffff48;
  MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> local_98;
  MeshAttributeIndicesEncodingData *in_stack_ffffffffffffff90;
  MeshAttributeCornerTable *connectivity;
  MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>
  *in_stack_ffffffffffffff98;
  MeshAttributeIndicesEncodingData *encoding_data_00;
  byte local_1d;
  char local_16;
  char local_15;
  bool local_1;
  
  PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
  bVar2 = DecoderBuffer::Decode<signed_char>
                    ((DecoderBuffer *)in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
  if (!bVar2) {
    return false;
  }
  PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
  bVar2 = DecoderBuffer::Decode<unsigned_char>
                    ((DecoderBuffer *)in_stack_fffffffffffffdf8,(uchar *)in_stack_fffffffffffffdf0);
  if (!bVar2) {
    return false;
  }
  if (local_15 < '\0') {
    if (-1 < *(int *)(in_RDI + 0x1f0)) {
      return false;
    }
    *(int *)(in_RDI + 0x1f0) = in_ESI;
  }
  else {
    sVar4 = std::
            vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
            ::size((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                    *)(in_RDI + 0x1f8));
    if (sVar4 <= (ulong)(long)local_15) {
      return false;
    }
    pvVar5 = std::
             vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
             ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                           *)(in_RDI + 0x1f8),(long)local_15);
    if (-1 < pvVar5->decoder_id) {
      return false;
    }
    pvVar5 = std::
             vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
             ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                           *)(in_RDI + 0x1f8),(long)local_15);
    pvVar5->decoder_id = in_ESI;
  }
  uVar3 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 8));
  bVar1 = 0;
  if (0x101 < uVar3) {
    PointCloudDecoder::buffer(*(PointCloudDecoder **)(in_RDI + 8));
    bVar2 = DecoderBuffer::Decode<unsigned_char>
                      ((DecoderBuffer *)in_stack_fffffffffffffdf8,(uchar *)in_stack_fffffffffffffdf0
                      );
    if (!bVar2) {
      return false;
    }
    bVar1 = local_1d;
    if (1 < local_1d) {
      return false;
    }
  }
  mesh_00 = MeshDecoder::mesh(*(MeshDecoder **)(in_RDI + 8));
  std::unique_ptr<draco::PointsSequencer,std::default_delete<draco::PointsSequencer>>::
  unique_ptr<std::default_delete<draco::PointsSequencer>,void>
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             in_stack_fffffffffffffdf0);
  if (local_16 == '\0') {
    if (-1 < local_15) {
      std::
      vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
      ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                    *)(in_RDI + 0x1f8),(long)local_15);
      pvVar5 = std::
               vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
               ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                             *)(in_RDI + 0x1f8),(long)local_15);
      pvVar5->is_connectivity_used = false;
    }
    if (bVar1 == 1) {
      CreateVertexTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
      operator=((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffdf0,
                (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffde8);
      std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
      ~unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                   *)in_stack_fffffffffffffdf0);
    }
    else {
      if (bVar1 != 0) {
        local_1 = false;
        goto LAB_00171650;
      }
      CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
      operator=((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffdf0,
                (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffde8);
      std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
      ~unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                   *)in_stack_fffffffffffffdf0);
    }
  }
  else {
    if (bVar1 != 0) {
      local_1 = false;
      goto LAB_00171650;
    }
    if (local_15 < '\0') {
      local_1 = false;
      goto LAB_00171650;
    }
    pvVar5 = std::
             vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
             ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                           *)(in_RDI + 0x1f8),(long)local_15);
    encoding_data_00 = &pvVar5->encoding_data;
    pvVar5 = std::
             vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
             ::operator[]((vector<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                           *)(in_RDI + 0x1f8),(long)local_15);
    connectivity = &pvVar5->connectivity_data;
    operator_new(0xc0);
    MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
    ::MeshTraversalSequencer
              (in_stack_fffffffffffffe10,(Mesh *)in_stack_fffffffffffffe08,
               (MeshAttributeIndicesEncodingData *)in_stack_fffffffffffffe00);
    std::
    unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>>>,std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>>>>>
    ::
    unique_ptr<std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>>>>,void>
              ((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                *)in_stack_fffffffffffffdf0,(pointer)in_stack_fffffffffffffde8);
    sequencer_00 = std::
                   unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                   ::get((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                          *)in_stack_fffffffffffffdf0);
    MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::
    MeshAttributeIndicesEncodingObserver
              (&local_98,connectivity,mesh_00,&sequencer_00->super_PointsSequencer,encoding_data_00)
    ;
    DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::DepthFirstTraverser
              ((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                *)in_stack_fffffffffffffdf0);
    traversal_observer.att_connectivity_._4_4_ = in_stack_fffffffffffffe24;
    traversal_observer.att_connectivity_._0_4_ = in_stack_fffffffffffffe20;
    traversal_observer.encoding_data_ =
         (MeshAttributeIndicesEncodingData *)in_stack_fffffffffffffe28;
    traversal_observer.mesh_._0_7_ = in_stack_fffffffffffffe30;
    traversal_observer.mesh_._7_1_ = in_stack_fffffffffffffe37;
    traversal_observer.sequencer_ = in_stack_fffffffffffffe38;
    TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::Init((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,traversal_observer);
    std::
    unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
    ::operator->((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                  *)0x171412);
    MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
    ::SetTraverser((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                    *)local_98.encoding_data_,
                   (DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                    *)local_98.att_connectivity_);
    std::unique_ptr<draco::PointsSequencer,std::default_delete<draco::PointsSequencer>>::operator=
              ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               local_98.sequencer_,
               (unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                *)local_98.mesh_);
    DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::~DepthFirstTraverser
              ((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                *)local_98.encoding_data_);
    std::
    unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
    ::~unique_ptr((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                   *)local_98.encoding_data_);
    in_stack_fffffffffffffde8 = local_98.att_connectivity_;
    in_stack_fffffffffffffdf0 =
         (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
          *)local_98.encoding_data_;
    in_stack_fffffffffffffdf8 = local_98.mesh_;
    in_stack_fffffffffffffe00 = (SequentialAttributeDecodersController *)local_98.sequencer_;
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                      *)0x1714d6);
  if (bVar2) {
    operator_new(0x80);
    std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
    unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               in_stack_fffffffffffffdf0,
               (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               in_stack_fffffffffffffde8);
    SequentialAttributeDecodersController::SequentialAttributeDecodersController
              (in_stack_fffffffffffffe00,
               (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               in_stack_fffffffffffffdf8);
    std::
    unique_ptr<draco::SequentialAttributeDecodersController,std::default_delete<draco::SequentialAttributeDecodersController>>
    ::unique_ptr<std::default_delete<draco::SequentialAttributeDecodersController>,void>
              ((unique_ptr<draco::SequentialAttributeDecodersController,_std::default_delete<draco::SequentialAttributeDecodersController>_>
                *)in_stack_fffffffffffffdf0,(pointer)in_stack_fffffffffffffde8);
    std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
    ~unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffdf0);
    std::
    unique_ptr<draco::AttributesDecoderInterface,std::default_delete<draco::AttributesDecoderInterface>>
    ::
    unique_ptr<draco::SequentialAttributeDecodersController,std::default_delete<draco::SequentialAttributeDecodersController>,void>
              ((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                *)in_stack_fffffffffffffe00,
               (unique_ptr<draco::SequentialAttributeDecodersController,_std::default_delete<draco::SequentialAttributeDecodersController>_>
                *)in_stack_fffffffffffffdf8);
    local_1 = PointCloudDecoder::SetAttributesDecoder
                        ((PointCloudDecoder *)in_stack_fffffffffffffe08,
                         (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                         (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                          *)in_stack_fffffffffffffdf8);
    std::
    unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
    ::~unique_ptr((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                   *)in_stack_fffffffffffffe00);
    std::
    unique_ptr<draco::SequentialAttributeDecodersController,_std::default_delete<draco::SequentialAttributeDecodersController>_>
    ::~unique_ptr((unique_ptr<draco::SequentialAttributeDecodersController,_std::default_delete<draco::SequentialAttributeDecodersController>_>
                   *)in_stack_fffffffffffffdf0);
  }
  else {
    local_1 = false;
  }
LAB_00171650:
  std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::~unique_ptr
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             in_stack_fffffffffffffdf0);
  return local_1;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::CreateAttributesDecoder(
    int32_t att_decoder_id) {
  int8_t att_data_id;
  if (!decoder_->buffer()->Decode(&att_data_id)) {
    return false;
  }
  uint8_t decoder_type;
  if (!decoder_->buffer()->Decode(&decoder_type)) {
    return false;
  }

  if (att_data_id >= 0) {
    if (att_data_id >= attribute_data_.size()) {
      return false;  // Unexpected attribute data.
    }

    // Ensure that the attribute data is not mapped to a different attributes
    // decoder already.
    if (attribute_data_[att_data_id].decoder_id >= 0) {
      return false;
    }

    attribute_data_[att_data_id].decoder_id = att_decoder_id;
  } else {
    // Assign the attributes decoder to |pos_encoding_data_|.
    if (pos_data_decoder_id_ >= 0) {
      return false;  // Some other decoder is already using the data. Error.
    }
    pos_data_decoder_id_ = att_decoder_id;
  }

  MeshTraversalMethod traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
  if (decoder_->bitstream_version() >= DRACO_BITSTREAM_VERSION(1, 2)) {
    uint8_t traversal_method_encoded;
    if (!decoder_->buffer()->Decode(&traversal_method_encoded)) {
      return false;
    }
    // Check that decoded traversal method is valid.
    if (traversal_method_encoded >= NUM_TRAVERSAL_METHODS) {
      return false;
    }
    traversal_method =
        static_cast<MeshTraversalMethod>(traversal_method_encoded);
  }

  const Mesh *mesh = decoder_->mesh();
  std::unique_ptr<PointsSequencer> sequencer;

  if (decoder_type == MESH_VERTEX_ATTRIBUTE) {
    // Per-vertex attribute decoder.

    MeshAttributeIndicesEncodingData *encoding_data = nullptr;
    if (att_data_id < 0) {
      encoding_data = &pos_encoding_data_;
    } else {
      encoding_data = &attribute_data_[att_data_id].encoding_data;
      // Mark the attribute connectivity data invalid to ensure it's not used
      // later on.
      attribute_data_[att_data_id].is_connectivity_used = false;
    }
    // Defining sequencer via a traversal scheme.
    if (traversal_method == MESH_TRAVERSAL_PREDICTION_DEGREE) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef MaxPredictionDegreeTraverser<CornerTable, AttObserver>
          AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else if (traversal_method == MESH_TRAVERSAL_DEPTH_FIRST) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef DepthFirstTraverser<CornerTable, AttObserver> AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else {
      return false;  // Unsupported method
    }
  } else {
    if (traversal_method != MESH_TRAVERSAL_DEPTH_FIRST) {
      return false;  // Unsupported method.
    }
    if (att_data_id < 0) {
      return false;  // Attribute data must be specified.
    }

    // Per-corner attribute decoder.

    typedef MeshAttributeIndicesEncodingObserver<MeshAttributeCornerTable>
        AttObserver;
    typedef DepthFirstTraverser<MeshAttributeCornerTable, AttObserver>
        AttTraverser;

    MeshAttributeIndicesEncodingData *const encoding_data =
        &attribute_data_[att_data_id].encoding_data;
    const MeshAttributeCornerTable *const corner_table =
        &attribute_data_[att_data_id].connectivity_data;

    std::unique_ptr<MeshTraversalSequencer<AttTraverser>> traversal_sequencer(
        new MeshTraversalSequencer<AttTraverser>(mesh, encoding_data));

    AttObserver att_observer(corner_table, mesh, traversal_sequencer.get(),
                             encoding_data);

    AttTraverser att_traverser;
    att_traverser.Init(corner_table, att_observer);

    traversal_sequencer->SetTraverser(att_traverser);
    sequencer = std::move(traversal_sequencer);
  }

  if (!sequencer) {
    return false;
  }

  std::unique_ptr<SequentialAttributeDecodersController> att_controller(
      new SequentialAttributeDecodersController(std::move(sequencer)));

  return decoder_->SetAttributesDecoder(att_decoder_id,
                                        std::move(att_controller));
}